

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O2

void Wlc_WriteTableOne(FILE *pFile,int nFans,int nOuts,word *pTable,int Id)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = (byte)nFans & 0x1f;
  uVar4 = 1 << bVar1;
  uVar2 = nOuts - 1;
  if ((uVar2 < 0x40) && ((byte)(0x40U % (byte)nOuts) == 0)) {
    fprintf((FILE *)pFile,"module table%d(ind, val);\n",Id);
    fprintf((FILE *)pFile,"  input  [%d:0] ind;\n",(ulong)(nFans - 1));
    fprintf((FILE *)pFile,"  output [%d:0] val;\n",(ulong)uVar2);
    fprintf((FILE *)pFile,"  reg    [%d:0] val;\n",(ulong)uVar2);
    fwrite("  always @(ind)\n",0x10,1,(FILE *)pFile);
    fwrite("  begin\n",8,1,(FILE *)pFile);
    fwrite("    case (ind)\n",0xf,1,(FILE *)pFile);
    if (1 << bVar1 < 1) {
      uVar4 = 0;
    }
    uVar2 = 0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile,"      %d\'h%x: val = %d\'h%x;\n",nFans,(ulong)uVar3,(ulong)(uint)nOuts,
              (ulong)((uint)(pTable[uVar2 >> 6] >> ((byte)uVar2 & 0x3f)) &
                     (uint)(0xffffffffffffffff >> (-(byte)nOuts & 0x3f))));
      uVar2 = uVar2 + nOuts;
    }
    fwrite("    endcase\n",0xc,1,(FILE *)pFile);
    fwrite("  end\n",6,1,(FILE *)pFile);
    fwrite("endmodule\n",10,1,(FILE *)pFile);
    fputc(10,(FILE *)pFile);
    return;
  }
  __assert_fail("nOuts > 0 && nOuts <= 64 && (64 % nOuts) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWriteVer.c"
                ,0x31,"void Wlc_WriteTableOne(FILE *, int, int, word *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_WriteTableOne( FILE * pFile, int nFans, int nOuts, word * pTable, int Id )
{
    int m, nMints = (1<<nFans);
//    Abc_TtPrintHexArrayRev( stdout, pTable, nMints );  printf( "\n" );
    assert( nOuts > 0 && nOuts <= 64 && (64 % nOuts) == 0 );
    fprintf( pFile, "module table%d(ind, val);\n", Id );
    fprintf( pFile, "  input  [%d:0] ind;\n", nFans-1 );
    fprintf( pFile, "  output [%d:0] val;\n", nOuts-1 );
    fprintf( pFile, "  reg    [%d:0] val;\n", nOuts-1 );
    fprintf( pFile, "  always @(ind)\n" );
    fprintf( pFile, "  begin\n" );
    fprintf( pFile, "    case (ind)\n" );
    for ( m = 0; m < nMints; m++ )
    fprintf( pFile, "      %d\'h%x: val = %d\'h%x;\n", nFans, m, nOuts, (unsigned)((pTable[(nOuts * m) >> 6] >> ((nOuts * m) & 63)) & Abc_Tt6Mask(nOuts)) );
    fprintf( pFile, "    endcase\n" );
    fprintf( pFile, "  end\n" );
    fprintf( pFile, "endmodule\n" );
    fprintf( pFile, "\n" );
}